

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  AABBNodeMB4D *node1;
  ulong uVar11;
  long lVar12;
  NodeRef *pNVar13;
  size_t sVar14;
  uint uVar15;
  size_t sVar16;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  float fVar18;
  float fVar19;
  float fVar24;
  float fVar26;
  float fVar27;
  float fVar28;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar25;
  undefined1 in_ZMM0 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  vint4 ai_2;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar44;
  float fVar45;
  vint4 ai_1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai;
  undefined1 auVar60 [16];
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  Precalculations pre;
  undefined1 local_17b8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17a8;
  vbool<4> valid0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar9 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar30 = vpcmpeqd_avx(auVar9,(undefined1  [16])valid_i->field_0);
    auVar61 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61,5);
    auVar10 = auVar30 & auVar9;
    if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar10[0xf] < '\0')
    {
      auVar6 = vandps_avx(auVar9,auVar30);
      auVar9 = *(undefined1 (*) [16])ray;
      auVar30 = *(undefined1 (*) [16])(ray + 0x10);
      auVar10 = *(undefined1 (*) [16])(ray + 0x20);
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar39);
      auVar51._8_4_ = 0x219392ef;
      auVar51._0_8_ = 0x219392ef219392ef;
      auVar51._12_4_ = 0x219392ef;
      auVar32 = vcmpps_avx(auVar32,auVar51,1);
      auVar21 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar51,auVar32);
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar39);
      auVar32 = vcmpps_avx(auVar32,auVar51,1);
      auVar22 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar51,auVar32);
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar39);
      auVar32 = vcmpps_avx(auVar32,auVar51,1);
      auVar32 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar51,auVar32);
      auVar39 = vrcpps_avx(auVar21);
      fVar18 = auVar39._0_4_;
      auVar36._0_4_ = auVar21._0_4_ * fVar18;
      fVar23 = auVar39._4_4_;
      auVar36._4_4_ = auVar21._4_4_ * fVar23;
      fVar25 = auVar39._8_4_;
      auVar36._8_4_ = auVar21._8_4_ * fVar25;
      fVar27 = auVar39._12_4_;
      auVar36._12_4_ = auVar21._12_4_ * fVar27;
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar55,auVar36);
      auVar21 = vrcpps_avx(auVar22);
      fVar38 = auVar21._0_4_;
      auVar47._0_4_ = fVar38 * auVar22._0_4_;
      fVar44 = auVar21._4_4_;
      auVar47._4_4_ = fVar44 * auVar22._4_4_;
      fVar45 = auVar21._8_4_;
      auVar47._8_4_ = fVar45 * auVar22._8_4_;
      fVar46 = auVar21._12_4_;
      auVar47._12_4_ = fVar46 * auVar22._12_4_;
      auVar22 = vsubps_avx(auVar55,auVar47);
      auVar21 = vrcpps_avx(auVar32);
      fVar19 = auVar21._0_4_;
      auVar40._0_4_ = fVar19 * auVar32._0_4_;
      fVar24 = auVar21._4_4_;
      auVar40._4_4_ = fVar24 * auVar32._4_4_;
      fVar26 = auVar21._8_4_;
      auVar40._8_4_ = fVar26 * auVar32._8_4_;
      fVar28 = auVar21._12_4_;
      auVar40._12_4_ = fVar28 * auVar32._12_4_;
      auVar21 = vsubps_avx(auVar55,auVar40);
      auVar32 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar61);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar7.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar32,auVar6);
      auVar32 = vpcmpeqd_avx(auVar21,auVar21);
      local_17b8._4_4_ = auVar6._4_4_ ^ auVar32._4_4_;
      local_17b8._0_4_ = auVar6._0_4_ ^ auVar32._0_4_;
      local_17b8._8_4_ = auVar6._8_4_ ^ auVar32._8_4_;
      local_17b8._12_4_ = auVar6._12_4_ ^ auVar32._12_4_;
      fVar38 = fVar38 + fVar38 * auVar22._0_4_;
      fVar44 = fVar44 + fVar44 * auVar22._4_4_;
      fVar45 = fVar45 + fVar45 * auVar22._8_4_;
      fVar46 = fVar46 + fVar46 * auVar22._12_4_;
      auVar61 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61);
      auVar32._8_4_ = 0xff800000;
      auVar32._0_8_ = 0xff800000ff800000;
      auVar32._12_4_ = 0xff800000;
      auVar61 = vblendvps_avx(auVar32,auVar61,auVar6);
      auVar62 = ZEXT1664(auVar61);
      fVar18 = fVar18 + fVar18 * auVar39._0_4_;
      fVar23 = fVar23 + fVar23 * auVar39._4_4_;
      fVar25 = fVar25 + fVar25 * auVar39._8_4_;
      fVar27 = fVar27 + fVar27 * auVar39._12_4_;
      fVar19 = fVar19 + fVar19 * auVar21._0_4_;
      fVar24 = fVar24 + fVar24 * auVar21._4_4_;
      fVar26 = fVar26 + fVar26 * auVar21._8_4_;
      fVar28 = fVar28 + fVar28 * auVar21._12_4_;
      pNVar13 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar17 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar7;
LAB_00ed2360:
      sVar16 = pNVar13[-1].ptr;
      if (sVar16 != 0xfffffffffffffff8) {
        pNVar13 = pNVar13 + -1;
        paVar1 = paVar17 + -1;
        paVar17 = paVar17 + -1;
        auVar61 = auVar62._0_16_;
        aVar29.v = (__m128)vcmpps_avx(*paVar1,auVar61,1);
        local_17a8 = *paVar1;
        if (((((undefined1  [16])aVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             ((undefined1  [16])aVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            ((undefined1  [16])aVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            aVar29.i[3]._3_1_ < '\0') {
          do {
            uVar15 = (uint)sVar16;
            if ((sVar16 & 8) != 0) {
              if (sVar16 == 0xfffffffffffffff8) goto LAB_00ed2692;
              auVar32 = vcmpps_avx(auVar61,(undefined1  [16])local_17a8,6);
              if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar32[0xf] < '\0') {
                aVar20._0_8_ = local_17b8._0_8_ ^ 0xffffffffffffffff;
                aVar20._8_4_ = local_17b8._8_4_ ^ 0xffffffff;
                aVar20._12_4_ = local_17b8._12_4_ ^ 0xffffffff;
                lVar12 = (ulong)(uVar15 & 0xf) - 7;
                prim = (Primitive_conflict4 *)(sVar16 & 0xfffffffffffffff0);
                goto LAB_00ed25e9;
              }
              break;
            }
            uVar11 = sVar16 & 0xfffffffffffffff0;
            aVar29.i[2] = 0x7f800000;
            aVar29._0_8_ = 0x7f8000007f800000;
            aVar29.i[3] = 0x7f800000;
            sVar16 = 8;
            for (lVar12 = -0x10;
                (lVar12 != 0 && (sVar5 = *(size_t *)(uVar11 + 0x20 + lVar12 * 2), sVar5 != 8));
                lVar12 = lVar12 + 4) {
              fVar2 = *(float *)(uVar11 + 0x90 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x30 + lVar12);
              auVar32 = *(undefined1 (*) [16])(ray + 0x70);
              fVar31 = auVar32._0_4_;
              fVar33 = auVar32._4_4_;
              fVar34 = auVar32._8_4_;
              fVar35 = auVar32._12_4_;
              auVar37._0_4_ = fVar31 * fVar2 + fVar3;
              auVar37._4_4_ = fVar33 * fVar2 + fVar3;
              auVar37._8_4_ = fVar34 * fVar2 + fVar3;
              auVar37._12_4_ = fVar35 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar11 + 0xb0 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x50 + lVar12);
              auVar41._0_4_ = fVar31 * fVar2 + fVar3;
              auVar41._4_4_ = fVar33 * fVar2 + fVar3;
              auVar41._8_4_ = fVar34 * fVar2 + fVar3;
              auVar41._12_4_ = fVar35 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar11 + 0xd0 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x70 + lVar12);
              auVar48._0_4_ = fVar31 * fVar2 + fVar3;
              auVar48._4_4_ = fVar33 * fVar2 + fVar3;
              auVar48._8_4_ = fVar34 * fVar2 + fVar3;
              auVar48._12_4_ = fVar35 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar11 + 0xa0 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x40 + lVar12);
              auVar52._0_4_ = fVar31 * fVar2 + fVar3;
              auVar52._4_4_ = fVar33 * fVar2 + fVar3;
              auVar52._8_4_ = fVar34 * fVar2 + fVar3;
              auVar52._12_4_ = fVar35 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar11 + 0xc0 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x60 + lVar12);
              auVar56._0_4_ = fVar3 + fVar31 * fVar2;
              auVar56._4_4_ = fVar3 + fVar33 * fVar2;
              auVar56._8_4_ = fVar3 + fVar34 * fVar2;
              auVar56._12_4_ = fVar3 + fVar35 * fVar2;
              fVar2 = *(float *)(uVar11 + 0xe0 + lVar12);
              fVar3 = *(float *)(uVar11 + 0x80 + lVar12);
              auVar58._0_4_ = fVar2 * fVar31 + fVar3;
              auVar58._4_4_ = fVar2 * fVar33 + fVar3;
              auVar58._8_4_ = fVar2 * fVar34 + fVar3;
              auVar58._12_4_ = fVar2 * fVar35 + fVar3;
              auVar21 = vsubps_avx(auVar37,auVar9);
              auVar60._0_4_ = fVar18 * auVar21._0_4_;
              auVar60._4_4_ = fVar23 * auVar21._4_4_;
              auVar60._8_4_ = fVar25 * auVar21._8_4_;
              auVar60._12_4_ = fVar27 * auVar21._12_4_;
              auVar21 = vsubps_avx(auVar41,auVar30);
              auVar42._0_4_ = fVar38 * auVar21._0_4_;
              auVar42._4_4_ = fVar44 * auVar21._4_4_;
              auVar42._8_4_ = fVar45 * auVar21._8_4_;
              auVar42._12_4_ = fVar46 * auVar21._12_4_;
              auVar21 = vsubps_avx(auVar48,auVar10);
              auVar49._0_4_ = fVar19 * auVar21._0_4_;
              auVar49._4_4_ = fVar24 * auVar21._4_4_;
              auVar49._8_4_ = fVar26 * auVar21._8_4_;
              auVar49._12_4_ = fVar28 * auVar21._12_4_;
              auVar21 = vsubps_avx(auVar52,auVar9);
              auVar53._0_4_ = fVar18 * auVar21._0_4_;
              auVar53._4_4_ = fVar23 * auVar21._4_4_;
              auVar53._8_4_ = fVar25 * auVar21._8_4_;
              auVar53._12_4_ = fVar27 * auVar21._12_4_;
              auVar21 = vsubps_avx(auVar56,auVar30);
              auVar57._0_4_ = fVar38 * auVar21._0_4_;
              auVar57._4_4_ = fVar44 * auVar21._4_4_;
              auVar57._8_4_ = fVar45 * auVar21._8_4_;
              auVar57._12_4_ = fVar46 * auVar21._12_4_;
              auVar21 = vsubps_avx(auVar58,auVar10);
              auVar59._0_4_ = fVar19 * auVar21._0_4_;
              auVar59._4_4_ = fVar24 * auVar21._4_4_;
              auVar59._8_4_ = fVar26 * auVar21._8_4_;
              auVar59._12_4_ = fVar28 * auVar21._12_4_;
              auVar21 = vpminsd_avx(auVar60,auVar53);
              auVar22 = vpminsd_avx(auVar42,auVar57);
              auVar21 = vpmaxsd_avx(auVar21,auVar22);
              auVar22 = vpminsd_avx(auVar49,auVar59);
              auVar21 = vpmaxsd_avx(auVar21,auVar22);
              auVar22 = vpmaxsd_avx(auVar60,auVar53);
              auVar39 = vpmaxsd_avx(auVar42,auVar57);
              auVar39 = vpminsd_avx(auVar22,auVar39);
              auVar22 = vpmaxsd_avx(auVar49,auVar59);
              auVar22 = vpminsd_avx(auVar22,auVar61);
              auVar39 = vpminsd_avx(auVar39,auVar22);
              auVar22 = vpmaxsd_avx(auVar21,(undefined1  [16])aVar7);
              if ((uVar15 & 7) == 6) {
                auVar22 = vcmpps_avx(auVar22,auVar39,2);
                uVar4 = *(undefined4 *)(uVar11 + 0xf0 + lVar12);
                auVar50._4_4_ = uVar4;
                auVar50._0_4_ = uVar4;
                auVar50._8_4_ = uVar4;
                auVar50._12_4_ = uVar4;
                auVar39 = vcmpps_avx(auVar50,auVar32,2);
                uVar4 = *(undefined4 *)(uVar11 + 0x100 + lVar12);
                auVar54._4_4_ = uVar4;
                auVar54._0_4_ = uVar4;
                auVar54._8_4_ = uVar4;
                auVar54._12_4_ = uVar4;
                auVar32 = vcmpps_avx(auVar32,auVar54,1);
                auVar32 = vandps_avx(auVar39,auVar32);
                auVar32 = vandps_avx(auVar32,auVar22);
              }
              else {
                auVar32 = vcmpps_avx(auVar22,auVar39,2);
              }
              auVar22 = vcmpps_avx(auVar61,(undefined1  [16])local_17a8,6);
              auVar32 = vandps_avx(auVar32,auVar22);
              auVar32 = vpslld_avx(auVar32,0x1f);
              sVar14 = sVar16;
              aVar8 = aVar29;
              if (((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar32[0xf] < '\0') &&
                 (auVar43._8_4_ = 0x7f800000, auVar43._0_8_ = 0x7f8000007f800000,
                 auVar43._12_4_ = 0x7f800000,
                 aVar8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar43,auVar21,auVar32), sVar14 = sVar5, sVar16 != 8)) {
                pNVar13->ptr = sVar16;
                pNVar13 = pNVar13 + 1;
                *paVar17 = aVar29;
                paVar17 = paVar17 + 1;
              }
              aVar29 = aVar8;
              sVar16 = sVar14;
            }
            local_17a8 = aVar29;
          } while (sVar16 != 8);
        }
        goto LAB_00ed2360;
      }
LAB_00ed2692:
      auVar9 = vandps_avx(local_17b8,auVar6);
      auVar30._8_4_ = 0xff800000;
      auVar30._0_8_ = 0xff800000ff800000;
      auVar30._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar30);
      *(undefined1 (*) [16])(ray + 0x80) = auVar9;
    }
  }
  return;
  while( true ) {
    valid0.field_0 = aVar20;
    InstanceArrayIntersectorKMB<4>::occluded
              ((InstanceArrayIntersectorKMB<4> *)&local_16e8,&valid0,&pre,ray,context,prim);
    aVar20.v = (__m128)vandnps_avx(local_16e8.v,valid0.field_0);
    auVar32 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    prim = prim + 1;
    aVar29 = local_16e8;
    if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
    break;
LAB_00ed25e9:
    lVar12 = lVar12 + -1;
    if (lVar12 == 0) break;
  }
  auVar32 = vpcmpeqd_avx((undefined1  [16])aVar29,(undefined1  [16])aVar29);
  auVar21._0_4_ = aVar20.i[0] ^ auVar32._0_4_;
  auVar21._4_4_ = aVar20.i[1] ^ auVar32._4_4_;
  auVar21._8_4_ = aVar20.i[2] ^ auVar32._8_4_;
  auVar21._12_4_ = aVar20.i[3] ^ auVar32._12_4_;
  local_17b8 = vorps_avx(local_17b8,auVar21);
  auVar32 = auVar32 & ~local_17b8;
  if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
  goto LAB_00ed2692;
  auVar22._8_4_ = 0xff800000;
  auVar22._0_8_ = 0xff800000ff800000;
  auVar22._12_4_ = 0xff800000;
  auVar61 = vblendvps_avx(auVar61,auVar22,local_17b8);
  auVar62 = ZEXT1664(auVar61);
  goto LAB_00ed2360;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }